

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O0

void __thiscall MetaSim::Event::Event(Event *this,int p)

{
  undefined4 in_ESI;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__Event_00228ca0;
  in_RDI[1] = 0;
  *(undefined1 *)(in_RDI + 2) = 0;
  in_RDI[0xb] = 0;
  in_RDI[0xc] = 0;
  in_RDI[9] = 0;
  in_RDI[10] = 0;
  in_RDI[7] = 0;
  in_RDI[8] = 0;
  in_RDI[5] = 0;
  in_RDI[6] = 0;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  std::
  deque<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_std::allocator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_>_>
  ::deque((deque<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_std::allocator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_>_>
           *)0x1f1c05);
  Tick::Tick((Tick *)(in_RDI + 0xd),0x7fffffffffffffff);
  Tick::Tick((Tick *)(in_RDI + 0xe),0x7fffffffffffffff);
  *(undefined4 *)(in_RDI + 0xf) = in_ESI;
  *(undefined4 *)((long)in_RDI + 0x7c) = in_ESI;
  *(undefined1 *)(in_RDI + 0x10) = 0;
  return;
}

Assistant:

Event::Event(int p) :
        _order(0),
        _isInQueue(false),
        _particles(),
        _time(MAXTICK),
        _lastTime(MAXTICK),
        _priority(p),
        _std_priority(p),
        _disposable(false)                
    {
    }